

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmu-uuid.cpp
# Opt level: O1

string * Replace(string *__return_storage_ptr__,string *haystack,string *needle,string *replacement)

{
  long lVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar2 = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char *)haystack,(ulong)(needle->_M_dataplus)._M_p,uVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)haystack,uVar2);
    if (lVar1 == -1) break;
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(replacement->_M_dataplus)._M_p);
    uVar2 = needle->_M_string_length + lVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Replace(
    const std::string& haystack,
    const std::string& needle,
    const std::string& replacement)
{
    auto output = std::string{};
    output.reserve(haystack.size());
    std::string::size_type i = 0;
    while (true) {
        const auto j = haystack.find(needle, i);
        output.append(haystack, i, j-i);
        if (j == std::string::npos) break;
        output.append(replacement);
        i = j + needle.size();
    }
    return output;
}